

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O1

string * google::protobuf::GetCapturedTestStdout_abi_cxx11_(void)

{
  Nonnull<const_char_*> failure_msg;
  string *in_RDI;
  LogMessage LStack_28;
  
  if (original_stdout_ == -1) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (-1,-1,"original_stdout_ != -1");
  }
  else {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    close(1);
    dup2(original_stdout_,1);
    close(original_stdout_);
    original_stdout_ = 0xffffffff;
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    File::ReadFileToStringOrDie((string *)&stdout_capture_filename__abi_cxx11_,in_RDI);
    remove(stdout_capture_filename__abi_cxx11_);
    return in_RDI;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
             ,0xbc,failure_msg);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_28,(char (*) [15])"Not capturing.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

std::string GetCapturedTestStdout() {
  ABSL_CHECK_NE(original_stdout_, -1) << "Not capturing.";

  close(1);
  dup2(original_stdout_, 1);
  close(original_stdout_);
  original_stdout_ = -1;

  std::string result;
  File::ReadFileToStringOrDie(stdout_capture_filename_, &result);

  remove(stdout_capture_filename_.c_str());

  return result;
}